

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::UseObjectLibraries
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *objs,string *config)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  reference ppcVar2;
  reference ppcVar3;
  mapped_type *pmVar4;
  undefined1 local_110 [8];
  string obj;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_e8;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_e0;
  const_iterator si;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmGeneratorTarget *ogt;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_b0;
  const_iterator ti;
  const_iterator end;
  cmGeneratorTarget *tgt;
  string objLib;
  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_70;
  __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
  local_68;
  const_iterator it;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> objectLibraries;
  undefined1 local_38 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectFiles;
  string *config_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *objs_local;
  cmGeneratorTarget *this_local;
  
  objectFiles.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)config;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  GetExternalObjects(this,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                          local_38,
                     (string *)
                     objectFiles.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
  local_70._M_current =
       (cmSourceFile **)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                 ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  __gnu_cxx::
  __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
  ::__normal_iterator<cmSourceFile_const**>
            ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
              *)&local_68,&local_70);
  while( true ) {
    objLib.field_2._8_8_ =
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38)
    ;
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                        *)((long)&objLib.field_2 + 8));
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&local_68);
    cmSourceFile::GetObjectLibrary_abi_cxx11_((string *)&tgt,*ppcVar3);
    end._M_current =
         (cmGeneratorTarget **)
         cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,(string *)&tgt);
    if ((cmGeneratorTarget *)end._M_current != (cmGeneratorTarget *)0x0) {
      std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it,
                 (value_type *)&end);
    }
    std::__cxx11::string::~string((string *)&tgt);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&local_68);
  }
  ti = cmRemoveDuplicates<std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
                 ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
  ogt = (cmGeneratorTarget *)
        std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                  ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
  __gnu_cxx::
  __normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
  ::__normal_iterator<cmGeneratorTarget**>
            ((__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>
              *)&local_b0,
             (__normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              *)&ogt);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_b0,&ti);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
              ::operator*(&local_b0);
    this_00 = *ppcVar2;
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
    GetObjectSources(this_00,(vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                             &si,
                     (string *)
                     objectFiles.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_e8._M_current =
         (cmSourceFile **)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
    __gnu_cxx::
    __normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
    ::__normal_iterator<cmSourceFile_const**>
              ((__normal_iterator<cmSourceFile_const*const*,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>
                *)&local_e0,&local_e8);
    while( true ) {
      obj.field_2._8_8_ =
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
      bVar1 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                          *)((long)&obj.field_2 + 8));
      if (!bVar1) break;
      std::__cxx11::string::string((string *)local_110,(string *)&this_00->ObjectDirectory);
      ppcVar3 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&local_e0);
      pmVar4 = std::
               map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this_00->Objects,ppcVar3);
      std::__cxx11::string::operator+=((string *)local_110,(string *)pmVar4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(objs,(value_type *)local_110);
      std::__cxx11::string::~string((string *)local_110);
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&local_e0);
    }
    std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
              ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&si);
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&local_b0);
  }
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
            ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&it);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  return;
}

Assistant:

void
cmGeneratorTarget::UseObjectLibraries(std::vector<std::string>& objs,
                                      const std::string &config) const
{
  std::vector<cmSourceFile const*> objectFiles;
  this->GetExternalObjects(objectFiles, config);
  std::vector<cmGeneratorTarget*> objectLibraries;
  for(std::vector<cmSourceFile const*>::const_iterator
      it = objectFiles.begin(); it != objectFiles.end(); ++it)
    {
    std::string objLib = (*it)->GetObjectLibrary();
    if (cmGeneratorTarget* tgt =
        this->LocalGenerator->FindGeneratorTargetToUse(objLib))
      {
      objectLibraries.push_back(tgt);
      }
    }

  std::vector<cmGeneratorTarget*>::const_iterator end
      = cmRemoveDuplicates(objectLibraries);

  for(std::vector<cmGeneratorTarget*>::const_iterator
        ti = objectLibraries.begin();
      ti != end; ++ti)
    {
    cmGeneratorTarget* ogt = *ti;
    std::vector<cmSourceFile const*> objectSources;
    ogt->GetObjectSources(objectSources, config);
    for(std::vector<cmSourceFile const*>::const_iterator
          si = objectSources.begin();
        si != objectSources.end(); ++si)
      {
      std::string obj = ogt->ObjectDirectory;
      obj += ogt->Objects[*si];
      objs.push_back(obj);
      }
    }
}